

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.pb.cc
# Opt level: O3

char * __thiscall google::protobuf::Any::_InternalParse(Any *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  byte bVar1;
  internal *this_02;
  char *size;
  bool bVar2;
  char cVar3;
  ArenaStringPtr *field_name;
  Arena *pAVar4;
  UnknownFieldSet *unknown;
  ArenaStringPtr *this_03;
  byte *pbVar5;
  string *psVar6;
  uint res;
  StringPiece str;
  pair<const_char_*,_unsigned_int> pVar7;
  byte *local_38;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->value_;
  this_03 = &this->type_url_;
  local_38 = (byte *)ptr;
  do {
    bVar2 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar2) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    res = (uint)bVar1;
    pbVar5 = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*pbVar5 * 0x80) - 0x80;
      if ((char)*pbVar5 < '\0') {
        pVar7 = internal::ReadTagFallback((char *)local_38,res);
        pbVar5 = (byte *)pVar7.first;
        if (pbVar5 == (byte *)0x0) {
          return (char *)0x0;
        }
        res = pVar7.second;
      }
      else {
        pbVar5 = local_38 + 2;
      }
    }
    local_38 = pbVar5;
    if (res >> 3 == 2) {
      if ((char)res != '\x12') goto LAB_00208ba9;
      pAVar4 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      psVar6 = this_01->ptr_;
      if (psVar6 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_01,pAVar4,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar6 = this_01->ptr_;
      }
      local_38 = (byte *)internal::InlineGreedyStringParser(psVar6,(char *)local_38,ctx);
LAB_00208be1:
      cVar3 = '\x02';
      if (local_38 == (byte *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      if ((res >> 3 != 1) || ((char)res != '\n')) {
LAB_00208ba9:
        if ((res == 0) || ((res & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar5;
        }
        if (((ulong)this_00->ptr_ & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
        goto LAB_00208be1;
      }
      pAVar4 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      psVar6 = this_03->ptr_;
      field_name = this_03;
      if (psVar6 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_03,pAVar4,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar6 = this_03->ptr_;
      }
      local_38 = (byte *)internal::InlineGreedyStringParser(psVar6,(char *)local_38,ctx);
      this_02 = (internal *)(psVar6->_M_dataplus)._M_p;
      size = (char *)psVar6->_M_string_length;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      str.length_ = (stringpiece_ssize_type)"google.protobuf.Any.type_url";
      str.ptr_ = size;
      bVar2 = internal::VerifyUTF8(this_02,str,(char *)field_name);
      if (!bVar2) {
        return (char *)0x0;
      }
      cVar3 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
    }
    if (cVar3 != '\x02') {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Any::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // string type_url = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_type_url();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Any.type_url"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // bytes value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          auto str = _internal_mutable_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}